

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

pairNf * __thiscall
pbrt::syntactic::ParamSet::getParamPairNf
          (pairNf *__return_storage_ptr__,ParamSet *this,string *name,pairNf *fallBack)

{
  long lVar1;
  _Base_ptr this_00;
  const_iterator cVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  runtime_error *prVar6;
  long *plVar7;
  _Base_ptr this_01;
  size_t i;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->param)._M_t._M_impl.super__Rb_tree_header) {
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              (__return_storage_ptr__,fallBack);
  }
  else {
    lVar1 = *(long *)(cVar2._M_node + 2);
    this_00 = cVar2._M_node[2]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
      }
    }
    if (lVar1 == 0) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = (long *)__dynamic_cast(lVar1,&Param::typeinfo,&ParamArray<float>::typeinfo,0);
    }
    this_01 = this_00;
    if (plVar3 == (long *)0x0) {
      this_01 = (_Base_ptr)0x0;
    }
    if (plVar3 != (long *)0x0 && this_00 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        UNLOCK();
        this_01 = this_00;
      }
      else {
        *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
        this_01 = this_00;
      }
    }
    if (plVar3 == (long *)0x0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"3f: found param of given name, but of wrong type! (name was \'",name
                    );
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70 = (long *)*plVar3;
      plVar7 = plVar3 + 2;
      if (local_70 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)&local_70);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = (**(code **)(*plVar3 + 8))(plVar3);
    if ((uVar4 & 1) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,
                     "found param of given name and type, but components aren\'t pairs! (PairNf, name=\'"
                     ,name);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_70 = (long *)*plVar3;
      plVar7 = plVar3 + 2;
      if (local_70 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)&local_70);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = (**(code **)(*plVar3 + 8))(plVar3);
    std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::vector
              (__return_storage_ptr__,uVar4 >> 1,(allocator_type *)&local_70);
    for (uVar4 = 0; uVar5 = (**(code **)(*plVar3 + 8))(plVar3), uVar4 < uVar5; uVar4 = uVar4 + 2) {
      *(undefined8 *)
       (&((__return_storage_ptr__->
          super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
          _M_impl.super__Vector_impl_data._M_start)->first + uVar4) =
           *(undefined8 *)(plVar3[3] + uVar4 * 4);
    }
    if (this_01 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (this_00 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

pairNf ParamSet::getParamPairNf(const std::string &name, const pairNf &fallBack) const
    {
      std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.find(name);
      if (it == param.end())
        return fallBack;
      std::shared_ptr<Param> pr = it->second;
      const std::shared_ptr<ParamArray<float>> p = std::dynamic_pointer_cast<ParamArray<float>>(pr);
      if (!p)
        throw std::runtime_error("3f: found param of given name, but of wrong type! (name was '"+name+"'");
      if (p->getSize() % 2 != 0)
        throw std::runtime_error("found param of given name and type, but components aren't pairs! (PairNf, name='"+name+"'");
      std::size_t N = p->getSize()/2;
      pairNf res(N);
      for (std::size_t i=0; i<p->getSize(); i+=2)
      {
        res[i/2] = std::make_pair(p->get(i), p->get(i+1));
      }
      return res;
    }